

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

shared_ptr<const_libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_file(torrent *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<const_libtorrent::torrent_info> sVar1;
  
  if (**(int **)(in_RSI + 0x18) < 1) {
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
  }
  else {
    ::std::__shared_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::torrent_info,void>
              ((__shared_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18)
              );
    in_RDX._M_pi = extraout_RDX;
  }
  sVar1.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar1.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_libtorrent::torrent_info>)
         sVar1.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const torrent_info> torrent::get_torrent_file() const
	{
		if (!m_torrent_file->is_valid()) return {};
		return m_torrent_file;
	}